

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O3

void EthBasePort::PrintDebugDataRTI(ostream *debugStream,quadlet_t *data,double clockPeriod)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  ostream *poVar4;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"PrintDebugDataRTI","");
  bVar2 = CheckDebugHeader(debugStream,&local_48,(char *)data,3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"*** RTI: ",9);
    bVar3 = *(byte *)((long)data + 7);
    if ((char)bVar3 < '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"sendBusy ",9);
      bVar3 = *(byte *)((long)data + 7);
    }
    if ((bVar3 & 0x40) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"sendRequest ",0xc);
      bVar3 = *(byte *)((long)data + 7);
    }
    if ((bVar3 & 8) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"responseRequired ",0x11);
      bVar3 = *(byte *)((long)data + 7);
    }
    if ((bVar3 & 4) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"recvNotReady ",0xd);
      bVar3 = *(byte *)((long)data + 7);
    }
    if ((bVar3 & 2) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"recvReady ",10);
      bVar3 = *(byte *)((long)data + 7);
    }
    if ((bVar3 & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"PortReady ",10);
    }
    cVar1 = (char)debugStream;
    std::ios::widen((char)*(undefined8 *)(*(long *)debugStream + -0x18) + cVar1);
    std::ostream::put(cVar1);
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"rxState: ",9);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"numPacketRecv: ",0xf);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", numBytesRecv: ",0x10);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"numPacketSent: ",0xf);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"txState: ",9);
    std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    if ((*(byte *)((long)data + 9) & 0x10) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,", txStateError ",0xf);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)debugStream + -0x18) + cVar1);
    std::ostream::put(cVar1);
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"respBytes: ",0xb);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"timeReceive: ",0xd);
    poVar4 = std::ostream::_M_insert<double>((double)(ushort)data[3] * clockPeriod);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," timeSend: ",0xb);
    poVar4 = std::ostream::_M_insert<double>((double)*(ushort *)((long)data + 0xe) * clockPeriod);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"bw_wait: ",9);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," (",2);
    poVar4 = std::ostream::_M_insert<double>
                       ((double)*(ushort *)((long)data + 0x12) * clockPeriod * 1000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," us)",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  return;
}

Assistant:

void EthBasePort::PrintDebugDataRTI(std::ostream &debugStream, const quadlet_t *data, double clockPeriod)
{
    // Following structure must match DebugData in EthRtInterface.v
    struct DebugData {
        char      header[4];        // Quad 0
        uint16_t  recv_nbytes;      // Quad 1
        uint8_t   numRecv;
        uint8_t   statusbits;
        uint8_t   numSent;          // Quad 2
        uint8_t   txStateBits;
        uint16_t  respBytes;
        uint16_t  timeReceive;      // Quad 3
        uint16_t  timeSend;
        uint16_t  quad4_low;        // Quad 4
        uint16_t  bw_wait;
        uint32_t  unused[3];        // Quad 5-7
    };
    if (sizeof(DebugData) != 8*sizeof(quadlet_t)) {
        debugStream << "PrintDebugDataRTI: structure packing problem" << std::endl;
        return;
    }
    const DebugData *p = reinterpret_cast<const DebugData *>(data);
    if (!CheckDebugHeader(debugStream, "PrintDebugDataRTI", p->header, 3))
        return;

    debugStream << "*** RTI: ";
    if (p->statusbits & 0x80) debugStream << "sendBusy ";
    if (p->statusbits & 0x40) debugStream << "sendRequest ";
    if (p->statusbits & 0x08) debugStream << "responseRequired ";
    if (p->statusbits & 0x04) debugStream << "recvNotReady ";
    if (p->statusbits & 0x02) debugStream << "recvReady ";
    if (p->statusbits & 0x01) debugStream << "PortReady ";
    debugStream << std::endl << "rxState: " << static_cast<uint16_t>((p->statusbits&0x30)>>4) << std::endl;
    debugStream << "numPacketRecv: " << static_cast<uint16_t>(p->numRecv)
                << ", numBytesRecv: " << p->recv_nbytes << std::endl;
    debugStream << "numPacketSent: " << static_cast<uint16_t>(p->numSent) << std::endl;
    debugStream << "txState: " << static_cast<uint16_t>(p->txStateBits&0x07);
    if (p->txStateBits&0x10) debugStream << ", txStateError ";
    debugStream << std::endl << "respBytes: " << p->respBytes << std::endl;
    const double bits2uS = clockPeriod*1e6;
    debugStream << "timeReceive: " << (p->timeReceive*clockPeriod) << " timeSend: " << (p->timeSend*clockPeriod) << std::endl;
    debugStream << "bw_wait: " << std::dec << p->bw_wait << " (" << p->bw_wait*bits2uS << " us)" << std::endl;
}